

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Train.cpp
# Opt level: O1

float trainIterate(vector<layer_t_*,_std::allocator<layer_t_*>_> *layers,
                  tensor_t<float> *train_tensor,tensor_t<float> *expected_output)

{
  pointer pfVar1;
  layer_type lVar2;
  fc_layer_t *this;
  bool bVar3;
  undefined1 auVar4 [32];
  undefined8 uVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  pointer pplVar10;
  pointer pplVar11;
  tensor_t<float> *ptVar12;
  ulong uVar13;
  long lVar14;
  byte bVar15;
  float fVar16;
  float fVar24;
  undefined1 auVar17 [16];
  float fVar22;
  float fVar23;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  float fVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  tensor_t<float> grads;
  tensor_t<float> local_48;
  undefined1 auVar21 [32];
  
  pplVar10 = (layers->super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  pplVar11 = (layers->super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  if (pplVar11 != pplVar10) {
    uVar13 = 0;
    do {
      ptVar12 = train_tensor;
      if (uVar13 != 0) {
        ptVar12 = &pplVar10[uVar13 - 1]->out;
      }
      activate(pplVar10[uVar13],ptVar12);
      uVar13 = uVar13 + 1;
      pplVar10 = (layers->super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      pplVar11 = (layers->super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
    } while (uVar13 < (ulong)((long)pplVar11 - (long)pplVar10 >> 3));
  }
  tensor_t<float>::operator-(&local_48,&pplVar11[-1]->out,expected_output);
  lVar14 = (long)(layers->super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(layers->super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  if (0 < lVar14) {
    do {
      pplVar10 = (layers->super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      ptVar12 = &local_48;
      if (lVar14 != (long)(layers->super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pplVar10 >> 3) {
        ptVar12 = &pplVar10[lVar14]->grads_in;
      }
      calc_grads(pplVar10[lVar14 + -1],ptVar12);
      bVar3 = 1 < lVar14;
      lVar14 = lVar14 + -1;
    } while (bVar3);
  }
  pplVar10 = (layers->super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  pplVar11 = (layers->super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  do {
    if (pplVar10 == pplVar11) {
      local_48.size.z = local_48.size.y * local_48.size.x * local_48.size.z;
      if (local_48.size.z < 1) {
        fVar16 = 0.0;
      }
      else {
        auVar18 = vpbroadcastq_avx512vl();
        uVar13 = 0;
        auVar21 = vpmovsxbq_avx2(ZEXT416(0x7060504));
        auVar4 = vpmovsxbq_avx2(ZEXT416(0x3020100));
        auVar29._8_4_ = 0x3f000000;
        auVar29._0_8_ = 0x3f0000003f000000;
        auVar29._12_4_ = 0x3f000000;
        auVar29._16_4_ = 0x3f000000;
        auVar29._20_4_ = 0x3f000000;
        auVar29._24_4_ = 0x3f000000;
        auVar29._28_4_ = 0x3f000000;
        auVar30._8_4_ = 0x7fffffff;
        auVar30._0_8_ = 0x7fffffff7fffffff;
        auVar30._12_4_ = 0x7fffffff;
        auVar30._16_4_ = 0x7fffffff;
        auVar30._20_4_ = 0x7fffffff;
        auVar30._24_4_ = 0x7fffffff;
        auVar30._28_4_ = 0x7fffffff;
        fVar16 = 0.0;
        fVar22 = 0.0;
        fVar23 = 0.0;
        fVar24 = 0.0;
        fVar25 = 0.0;
        fVar26 = 0.0;
        fVar27 = 0.0;
        fVar28 = 0.0;
        do {
          fVar38 = fVar28;
          fVar37 = fVar27;
          fVar36 = fVar26;
          fVar35 = fVar25;
          fVar34 = fVar24;
          fVar33 = fVar23;
          fVar32 = fVar22;
          fVar31 = fVar16;
          auVar19 = vpbroadcastq_avx512vl();
          auVar20 = vpor_avx2(auVar19,auVar21);
          auVar19 = vpor_avx2(auVar19,auVar4);
          uVar5 = vpcmpuq_avx512vl(auVar19,auVar18,2);
          bVar9 = (byte)uVar5;
          bVar15 = bVar9 & 0xf;
          uVar5 = vpcmpuq_avx512vl(auVar20,auVar18,2);
          bVar8 = (byte)uVar5;
          bVar7 = bVar8 << 4;
          pfVar1 = (expected_output->data).super__Vector_base<float,_std::allocator<float>_>._M_impl
                   .super__Vector_impl_data._M_start + uVar13;
          auVar20._4_4_ = (uint)((bVar9 & 2) >> 1) * (int)pfVar1[1];
          auVar20._0_4_ = (uint)(bVar9 & 1) * (int)*pfVar1;
          auVar20._8_4_ = (uint)((bVar9 & 4) >> 2) * (int)pfVar1[2];
          auVar20._12_4_ = (uint)(bVar15 >> 3) * (int)pfVar1[3];
          auVar20._16_4_ = (uint)(bVar8 & 1) * (int)pfVar1[4];
          auVar20._20_4_ = (uint)(bVar7 >> 5 & 1) * (int)pfVar1[5];
          auVar20._24_4_ = (uint)(bVar7 >> 6 & 1) * (int)pfVar1[6];
          auVar20._28_4_ = (uint)(bVar7 >> 7) * (int)pfVar1[7];
          uVar5 = vcmpps_avx512vl(auVar20,auVar29,0xe);
          bVar6 = (bVar15 | bVar7) & (byte)uVar5;
          pfVar1 = local_48.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar13;
          auVar19._4_4_ = (uint)(bVar6 >> 1 & 1) * (int)pfVar1[1];
          auVar19._0_4_ = (uint)(bVar6 & 1) * (int)*pfVar1;
          auVar19._8_4_ = (uint)(bVar6 >> 2 & 1) * (int)pfVar1[2];
          auVar19._12_4_ = (uint)(bVar6 >> 3 & 1) * (int)pfVar1[3];
          auVar19._16_4_ = (uint)(bVar6 >> 4 & 1) * (int)pfVar1[4];
          auVar19._20_4_ = (uint)(bVar6 >> 5 & 1) * (int)pfVar1[5];
          auVar19._24_4_ = (uint)(bVar6 >> 6 & 1) * (int)pfVar1[6];
          auVar19._28_4_ = (uint)(bVar6 >> 7) * (int)pfVar1[7];
          auVar20 = vandps_avx(auVar19,auVar30);
          bVar6 = ~(byte)uVar5 & (bVar15 | bVar7);
          fVar16 = (float)((uint)(bVar6 & 1) * (int)fVar31 |
                          (uint)!(bool)(bVar6 & 1) * (int)(auVar20._0_4_ + fVar31));
          bVar3 = (bool)(bVar6 >> 1 & 1);
          fVar22 = (float)((uint)bVar3 * (int)fVar32 | (uint)!bVar3 * (int)(auVar20._4_4_ + fVar32))
          ;
          bVar3 = (bool)(bVar6 >> 2 & 1);
          fVar23 = (float)((uint)bVar3 * (int)fVar33 | (uint)!bVar3 * (int)(auVar20._8_4_ + fVar33))
          ;
          bVar3 = (bool)(bVar6 >> 3 & 1);
          fVar24 = (float)((uint)bVar3 * (int)fVar34 | (uint)!bVar3 * (int)(auVar20._12_4_ + fVar34)
                          );
          bVar3 = (bool)(bVar6 >> 4 & 1);
          fVar25 = (float)((uint)bVar3 * (int)fVar35 | (uint)!bVar3 * (int)(auVar20._16_4_ + fVar35)
                          );
          bVar3 = (bool)(bVar6 >> 5 & 1);
          fVar26 = (float)((uint)bVar3 * (int)fVar36 | (uint)!bVar3 * (int)(auVar20._20_4_ + fVar36)
                          );
          bVar3 = (bool)(bVar6 >> 6 & 1);
          fVar27 = (float)((uint)bVar3 * (int)fVar37 | (uint)!bVar3 * (int)(auVar20._24_4_ + fVar37)
                          );
          fVar28 = (float)((uint)(bVar6 >> 7) * (int)fVar38 |
                          (uint)!(bool)(bVar6 >> 7) * (int)(auVar20._28_4_ + fVar38));
          uVar13 = uVar13 + 8;
        } while ((local_48.size.z + 7U & 0xfffffff8) != uVar13);
        auVar17._0_4_ = (uint)(bVar9 & 1) * (int)fVar16 | (uint)!(bool)(bVar9 & 1) * (int)fVar31;
        bVar3 = (bool)((bVar9 & 2) >> 1);
        auVar17._4_4_ = (uint)bVar3 * (int)fVar22 | (uint)!bVar3 * (int)fVar32;
        bVar3 = (bool)((bVar9 & 4) >> 2);
        auVar17._8_4_ = (uint)bVar3 * (int)fVar23 | (uint)!bVar3 * (int)fVar33;
        auVar17._12_4_ =
             (uint)(bVar15 >> 3) * (int)fVar24 | (uint)!(bool)(bVar15 >> 3) * (int)fVar34;
        auVar21._16_4_ = (uint)(bVar8 & 1) * (int)fVar25 | (uint)!(bool)(bVar8 & 1) * (int)fVar35;
        auVar21._0_16_ = auVar17;
        bVar3 = (bool)(bVar7 >> 5 & 1);
        auVar21._20_4_ = (uint)bVar3 * (int)fVar26 | (uint)!bVar3 * (int)fVar36;
        bVar3 = (bool)(bVar7 >> 6 & 1);
        auVar21._24_4_ = (uint)bVar3 * (int)fVar27 | (uint)!bVar3 * (int)fVar37;
        auVar21._28_4_ = (uint)(bVar7 >> 7) * (int)fVar28 | (uint)!(bool)(bVar7 >> 7) * (int)fVar38;
        auVar17 = vhaddps_avx(auVar21._16_16_,auVar17);
        auVar17 = vhaddps_avx(auVar17,auVar17);
        auVar17 = vhaddps_avx(auVar17,auVar17);
        fVar16 = auVar17._0_4_ * 100.0;
      }
      if (local_48.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return fVar16;
    }
    this = (fc_layer_t *)*pplVar10;
    lVar2 = (this->super_layer_t).type;
    if (1 < lVar2 - relu) {
      if (lVar2 == fc) {
        fc_layer_t::fix_weights(this);
      }
      else {
        if (lVar2 != conv) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/acstud[P]lab3-cnn/src/cnn/cnn.h"
                        ,0x2d,"void fix_weights(layer_t *)");
        }
        conv_layer_t::fix_weights((conv_layer_t *)this);
      }
    }
    pplVar10 = pplVar10 + 1;
  } while( true );
}

Assistant:

float trainIterate(std::vector<layer_t *> &layers, tensor_t<float> &train_tensor, tensor_t<float> &expected_output) {
  // Activate each layer with the training tensor as input
  for (int i = 0; i < layers.size(); i++) {
    if (i == 0)
      activate(layers[i], train_tensor);
    else
      activate(layers[i], layers[i - 1]->out);
  }

  // Check the difference with the label / expected output
  tensor_t<float> grads = layers.back()->out - expected_output;

  // Calculate the gradients
  for (ssize_t i = layers.size() - 1; i >= 0; i--) {
    if (i == layers.size() - 1)
      calc_grads(layers[i], grads);
    else
      calc_grads(layers[i], layers[i + 1]->grads_in);
  }

  // Potentially update the weights
  for (auto &layer : layers) {
    fix_weights(layer);
  }

  // Calculate the error
  float err = 0;
  for (int i = 0; i < grads.size.x * grads.size.y * grads.size.z; i++) {
    float f = expected_output.data[i];
    if (f > 0.5)
      err += abs(grads.data[i]);
  }
  return err * 100;
}